

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

CallReaction testing::Mock::GetReactionOnUninterestingCalls(void *mock_obj)

{
  CallReaction CVar1;
  long lVar2;
  mapped_type *pmVar3;
  long lVar4;
  ulong in_RDI;
  bool bVar5;
  key_type local_8;
  
  if ((anonymous_namespace)::g_uninteresting_call_reaction._16_8_ != 0) {
    lVar2 = 0x2419f8;
    lVar4 = (anonymous_namespace)::g_uninteresting_call_reaction._16_8_;
    do {
      bVar5 = *(ulong *)(lVar4 + 0x20) < in_RDI;
      if (!bVar5) {
        lVar2 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar5 * 8);
    } while (lVar4 != 0);
    if ((lVar2 != 0x2419f8) && (*(ulong *)(lVar2 + 0x20) <= in_RDI)) {
      pmVar3 = std::
               map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
               ::operator[]((map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
                             *)(anonymous_namespace)::g_uninteresting_call_reaction,&local_8);
      return *pmVar3;
    }
  }
  CVar1 = kWarn;
  if (FLAGS_gmock_default_mock_behavior < (kFail|kWarn)) {
    CVar1 = FLAGS_gmock_default_mock_behavior;
  }
  return CVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  return (g_uninteresting_call_reaction.count(mock_obj) == 0) ?
      internal::intToCallReaction(GMOCK_FLAG(default_mock_behavior)) :
      g_uninteresting_call_reaction[mock_obj];
}